

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

TriggerPrg * getRowTrigger(Parse *pParse,Trigger *pTrigger,Table *pTab,int orconf)

{
  u8 uVar1;
  sqlite3 *psVar2;
  Op *pOVar3;
  int iVar4;
  TriggerPrg *pTVar5;
  SubProgram *pSVar6;
  Vdbe *pVVar7;
  char *pcVar8;
  Expr *pEVar9;
  SrcList *pSVar10;
  IdList *pColumn;
  Upsert *pUpsert;
  Select *pSVar11;
  ExprList *pEVar12;
  Expr *in_R8;
  Parse *pPVar13;
  TriggerStep *pStep;
  long in_FS_OFFSET;
  NameContext sNC;
  Upsert *pUpsert_00;
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  Select *local_218;
  undefined1 local_208 [8];
  undefined8 uStack_200;
  int local_1f8;
  undefined4 uStack_1f4;
  char *pcStack_1f0;
  ExprList *local_1e8;
  Parse local_1e0;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pPVar13 = pParse->pToplevel;
  if (pParse->pToplevel == (Parse *)0x0) {
    pPVar13 = pParse;
  }
  for (pTVar5 = pPVar13->pTriggerPrg; pTVar5 != (TriggerPrg *)0x0; pTVar5 = pTVar5->pNext) {
    if ((pTVar5->pTrigger == pTrigger) && (pTVar5->orconf == orconf)) goto LAB_001a7163;
  }
  psVar2 = pParse->db;
  local_218 = (Select *)&DAT_aaaaaaaaaaaaaaaa;
  local_228._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_228._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_238._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_238._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_248._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_248._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  memset(&local_1e0,0xaa,0x1a8);
  pTVar5 = (TriggerPrg *)sqlite3DbMallocZero(psVar2,0x28);
  if (pTVar5 != (TriggerPrg *)0x0) {
    pTVar5->pNext = pPVar13->pTriggerPrg;
    pPVar13->pTriggerPrg = pTVar5;
    pSVar6 = (SubProgram *)sqlite3DbMallocZero(psVar2,0x30);
    pTVar5->pProgram = pSVar6;
    if (pSVar6 != (SubProgram *)0x0) {
      pVVar7 = pPVar13->pVdbe;
      pSVar6->pNext = pVVar7->pProgram;
      pVVar7->pProgram = pSVar6;
      pTVar5->pTrigger = pTrigger;
      pTVar5->orconf = orconf;
      pTVar5->aColmask[0] = 0xffffffff;
      pTVar5->aColmask[1] = 0xffffffff;
      memset(&local_1e0.zErrMsg,0,0xe0);
      memset(&local_1e0.sLastToken,0,0x88);
      local_1e0.pOuterParse = psVar2->pParse;
      psVar2->pParse = &local_1e0;
      local_1e0.db = psVar2;
      if (psVar2->mallocFailed != '\0') {
        sqlite3ErrorMsg(&local_1e0,"out of memory");
      }
      local_228 = (undefined1  [16])0x0;
      local_238 = (undefined1  [16])0x0;
      local_218 = (Select *)0x0;
      local_248._8_8_ = 0;
      local_248._0_8_ = &local_1e0;
      local_1e0.zAuthContext = pTrigger->zName;
      local_1e0.eTriggerOp = pTrigger->op;
      local_1e0.nQueryLoop = pParse->nQueryLoop;
      local_1e0.prepFlags = pParse->prepFlags;
      local_1e0.pToplevel = pPVar13;
      local_1e0.pTriggerTab = pTab;
      pVVar7 = sqlite3GetVdbe(&local_1e0);
      if (pVVar7 == (Vdbe *)0x0) {
        if (pParse->nErr == 0) {
          pParse->zErrMsg = local_1e0.zErrMsg;
          pParse->nErr = local_1e0.nErr;
          pParse->rc = local_1e0.rc;
        }
        else if (local_1e0.zErrMsg != (char *)0x0) {
          sqlite3DbFreeNN(local_1e0.db,local_1e0.zErrMsg);
        }
      }
      else {
        if (pTrigger->zName != (char *)0x0) {
          pcVar8 = sqlite3MPrintf(psVar2,"-- TRIGGER %s");
          sqlite3VdbeChangeP4(pVVar7,-1,pcVar8,-6);
        }
        if (pTrigger->pWhen == (Expr *)0x0) {
          pUpsert_00 = (Upsert *)0x0;
        }
        else {
          pUpsert_00 = (Upsert *)0x0;
          pEVar9 = exprDup(psVar2,pTrigger->pWhen,0,(EdupBuf *)0x0);
          if (psVar2->mallocFailed == '\0') {
            iVar4 = sqlite3ResolveExprNames((NameContext *)local_248,pEVar9);
            if (iVar4 == 0) {
              local_1e0.nLabel = local_1e0.nLabel - 1;
              pUpsert_00 = (Upsert *)(ulong)(uint)local_1e0.nLabel;
              sqlite3ExprIfFalse(&local_1e0,pEVar9,local_1e0.nLabel,0x10);
            }
          }
          if (pEVar9 != (Expr *)0x0) {
            sqlite3ExprDeleteNN(psVar2,pEVar9);
          }
        }
        psVar2 = local_1e0.db;
        pStep = pTrigger->step_list;
        if (pStep != (TriggerStep *)0x0) {
          do {
            pEVar12 = (ExprList *)(ulong)(uint)orconf;
            local_1e0.eOrconf = (u8)orconf;
            if (orconf == 0xb) {
              local_1e0.eOrconf = pStep->orconf;
            }
            if (pStep->zSpan != (char *)0x0) {
              pcVar8 = sqlite3MPrintf(psVar2,"-- %s");
              in_R8 = (Expr *)0x0;
              iVar4 = sqlite3VdbeAddOp3(local_1e0.pVdbe,0xb8,0x7fffffff,1,0);
              pEVar12 = (ExprList *)0xfffffffa;
              sqlite3VdbeChangeP4(local_1e0.pVdbe,iVar4,pcVar8,-6);
            }
            uVar1 = pStep->op;
            if (uVar1 == 0x80) {
              pSVar10 = sqlite3TriggerStepSrc(&local_1e0,pStep);
              pSVar11 = sqlite3SelectDup(psVar2,pStep->pSelect,0);
              pColumn = sqlite3IdListDup(psVar2,pStep->pIdList);
              uVar1 = local_1e0.eOrconf;
              pUpsert = sqlite3UpsertDup(psVar2,pStep->pUpsert);
              sqlite3Insert(&local_1e0,pSVar10,pSVar11,pColumn,(uint)uVar1,pUpsert);
LAB_001a6ffe:
              in_R8 = (Expr *)0x0;
              sqlite3VdbeAddOp3(local_1e0.pVdbe,0x83,0,0,0);
            }
            else {
              if (uVar1 == 0x81) {
                pSVar10 = sqlite3TriggerStepSrc(&local_1e0,pStep);
                if (pStep->pWhere == (Expr *)0x0) {
                  pEVar9 = (Expr *)0x0;
                }
                else {
                  pEVar12 = (ExprList *)0x0;
                  pEVar9 = exprDup(psVar2,pStep->pWhere,0,(EdupBuf *)0x0);
                }
                sqlite3DeleteFrom(&local_1e0,pSVar10,pEVar9,pEVar12,in_R8);
                goto LAB_001a6ffe;
              }
              if (uVar1 == 0x82) {
                pSVar10 = sqlite3TriggerStepSrc(&local_1e0,pStep);
                pEVar12 = sqlite3ExprListDup(psVar2,pStep->pExprList,0);
                if (pStep->pWhere == (Expr *)0x0) {
                  pEVar9 = (Expr *)0x0;
                }
                else {
                  pEVar9 = exprDup(psVar2,pStep->pWhere,0,(EdupBuf *)0x0);
                }
                sqlite3Update(&local_1e0,pSVar10,pEVar12,pEVar9,(uint)local_1e0.eOrconf,
                              (ExprList *)0x0,(Expr *)pParse,pUpsert_00);
                in_R8 = (Expr *)0x0;
                sqlite3VdbeAddOp3(local_1e0.pVdbe,0x83,0,0,0);
              }
              else {
                local_1e8 = (ExprList *)&DAT_aaaaaaaaaaaaaaaa;
                local_1f8 = -0x55555556;
                uStack_1f4 = 0xaaaaaaaa;
                pcStack_1f0 = &DAT_aaaaaaaaaaaaaaaa;
                local_208._0_4_ = 0xaaaaaaaa;
                local_208._4_4_ = -0x55555556;
                uStack_200 = &DAT_aaaaaaaaaaaaaaaa;
                pSVar11 = sqlite3SelectDup(psVar2,pStep->pSelect,0);
                local_208[0] = '\x04';
                pcStack_1f0 = (char *)0x0;
                local_208._4_4_ = 0;
                uStack_200._0_4_ = 0;
                uStack_200._4_4_ = 0;
                local_1f8 = 0;
                sqlite3Select(&local_1e0,pSVar11,(SelectDest *)local_208);
                if (pSVar11 != (Select *)0x0) {
                  clearSelect(psVar2,pSVar11,1);
                }
              }
            }
            pStep = pStep->pNext;
          } while (pStep != (TriggerStep *)0x0);
        }
        if ((int)pUpsert_00 != 0) {
          sqlite3VdbeResolveLabel(pVVar7,(int)pUpsert_00);
        }
        sqlite3VdbeAddOp3(pVVar7,0x46,0,0,0);
        if (pParse->nErr == 0) {
          pParse->zErrMsg = local_1e0.zErrMsg;
          pParse->nErr = local_1e0.nErr;
          pParse->rc = local_1e0.rc;
        }
        else if (local_1e0.zErrMsg != (char *)0x0) {
          sqlite3DbFreeNN(local_1e0.db,local_1e0.zErrMsg);
        }
        if (pParse->nErr == 0) {
          pOVar3 = pVVar7->aOp;
          resolveP2Values(pVVar7,&pPVar13->nMaxArg);
          pSVar6->nOp = pVVar7->nOp;
          pVVar7->aOp = (Op *)0x0;
          pSVar6->aOp = pOVar3;
        }
        pSVar6->nMem = local_1e0.nMem;
        pSVar6->nCsr = local_1e0.nTab;
        pSVar6->token = pTrigger;
        pTVar5->aColmask[0] = local_1e0.oldmask;
        pTVar5->aColmask[1] = local_1e0.newmask;
        sqlite3VdbeDelete(pVVar7);
      }
      sqlite3ParseObjectReset(&local_1e0);
      goto LAB_001a7155;
    }
  }
  pTVar5 = (TriggerPrg *)0x0;
LAB_001a7155:
  pParse->db->errByteOffset = -1;
LAB_001a7163:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return pTVar5;
  }
  __stack_chk_fail();
}

Assistant:

static TriggerPrg *getRowTrigger(
  Parse *pParse,       /* Current parse context */
  Trigger *pTrigger,   /* Trigger to code */
  Table *pTab,         /* The table trigger pTrigger is attached to */
  int orconf           /* ON CONFLICT algorithm. */
){
  Parse *pRoot = sqlite3ParseToplevel(pParse);
  TriggerPrg *pPrg;

  assert( pTrigger->zName==0 || pTab==tableOfTrigger(pTrigger) );

  /* It may be that this trigger has already been coded (or is in the
  ** process of being coded). If this is the case, then an entry with
  ** a matching TriggerPrg.pTrigger field will be present somewhere
  ** in the Parse.pTriggerPrg list. Search for such an entry.  */
  for(pPrg=pRoot->pTriggerPrg;
      pPrg && (pPrg->pTrigger!=pTrigger || pPrg->orconf!=orconf);
      pPrg=pPrg->pNext
  );

  /* If an existing TriggerPrg could not be located, create a new one. */
  if( !pPrg ){
    pPrg = codeRowTrigger(pParse, pTrigger, pTab, orconf);
    pParse->db->errByteOffset = -1;
  }

  return pPrg;
}